

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

bool __thiscall
deqp::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyValidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  GLchar *__s;
  GLuint GVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar7;
  byte *pbVar8;
  TestContext *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  reference pvVar13;
  ulong uVar14;
  reference pvVar15;
  MessageBuilder local_a18;
  value_type local_898;
  uint local_894;
  GLuint drawn_red_4;
  GLuint expected_red_4;
  GLuint i_9;
  GLuint i_8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_4;
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  undefined1 local_780 [8];
  Texture destination_texture;
  Program program;
  value_type local_580;
  value_type local_57c;
  GLuint drawn_red_3;
  GLuint expected_red_3;
  GLuint i_7;
  GLuint i_6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_3;
  float local_3d8;
  float local_3d4;
  GLfloat drawn_alpha;
  GLfloat drawn_blue;
  GLfloat drawn_green_1;
  GLfloat drawn_red_2;
  GLfloat expected_alpha;
  GLfloat expected_blue;
  GLfloat expected_green_1;
  GLfloat expected_red_2;
  GLuint i_5;
  GLuint i_4;
  vector<float,_std::allocator<float>_> pixels_2;
  int local_390;
  int local_38c;
  MessageBuilder local_388;
  char local_204;
  char local_203;
  char local_202;
  char local_201;
  uint local_200;
  GLbyte drawn_green;
  GLbyte drawn_red_1;
  GLbyte expected_green;
  GLbyte expected_red_1;
  GLuint i_3;
  GLuint i_2;
  vector<signed_char,_std::allocator<signed_char>_> pixels_1;
  MessageBuilder local_1d8;
  byte local_56;
  byte local_55;
  uint local_54;
  GLubyte drawn_red;
  uint uStack_50;
  GLubyte expected_red;
  GLuint i_1;
  GLuint i;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  bool result;
  Functions *gl;
  GLuint texture_id_local;
  ImageLoadStoreTest *this_local;
  Functions *gl_00;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TexelFetchTest).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar4);
  (*gl_00->memoryBarrier)(0x20);
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0xbd6);
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  if ((this->super_TexelFetchTest).m_test_case == R8) {
    RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0x100);
    for (uStack_50 = 0; uStack_50 < 0x100; uStack_50 = uStack_50 + 1) {
      vVar2 = (value_type)uStack_50;
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                          (ulong)uStack_50);
      *pvVar7 = vVar2;
    }
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    RobustBufferAccessBehavior::Texture::GetData(gl_00,0,0xde1,0x1903,0x1401,pvVar7);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (local_54 = 0; local_54 < 0x100; local_54 = local_54 + 1) {
      local_55 = (byte)local_54;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                          (ulong)local_54);
      local_56 = *pbVar8;
      if (local_55 != local_56) {
        pTVar9 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TestCase.m_context);
        pTVar10 = tcu::TestContext::getLog(pTVar9);
        tcu::TestLog::operator<<(&local_1d8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [16])"Invalid value: ");
        pixels_1.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)local_56;
        pMVar11 = tcu::MessageBuilder::operator<<
                            (pMVar11,(uint *)((long)&pixels_1.
                                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4));
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Expected value: ");
        pixels_1.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)local_55;
        pMVar11 = tcu::MessageBuilder::operator<<
                            (pMVar11,(uint *)&pixels_1.
                                              super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])" at offset: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_54);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  else if ((this->super_TexelFetchTest).m_test_case == RG8_SNORM) {
    RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,0x200);
    for (_drawn_green = 0; _drawn_green < 0x100; _drawn_green = _drawn_green + 1) {
      vVar3 = (value_type)_drawn_green;
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,
                           (ulong)(_drawn_green << 1));
      *pvVar12 = vVar3;
      vVar3 = (value_type)_drawn_green;
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,
                           (ulong)(_drawn_green * 2 + 1));
      *pvVar12 = vVar3;
    }
    pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                        ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,0);
    RobustBufferAccessBehavior::Texture::GetData(gl_00,0,0xde1,0x8227,0x1400,pvVar12);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (local_200 = 0; local_200 < 0x100; local_200 = local_200 + 1) {
      local_201 = ((byte)local_200 & 0xf) - 8;
      local_202 = (char)(local_200 >> 4) + -8;
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,
                           (ulong)(local_200 << 1));
      local_203 = *pvVar12;
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3,
                           (ulong)(local_200 * 2 + 1));
      local_204 = *pvVar12;
      if ((local_201 != local_203) || (local_202 != local_204)) {
        pTVar9 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TestCase.m_context);
        pTVar10 = tcu::TestContext::getLog(pTVar9);
        tcu::TestLog::operator<<(&local_388,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<(&local_388,(char (*) [16])"Invalid value: ");
        local_38c = (int)local_203;
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_38c);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        local_390 = (int)local_204;
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_390);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Expected value: ");
        pixels_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (int)local_201;
        pMVar11 = tcu::MessageBuilder::operator<<
                            (pMVar11,(int *)((long)&pixels_2.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4));
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pixels_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = (int)local_202;
        pMVar11 = tcu::MessageBuilder::operator<<
                            (pMVar11,(int *)&pixels_2.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])". At offset: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_200);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_388);
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)&i_3);
  }
  else if ((this->super_TexelFetchTest).m_test_case == RGBA32F) {
    RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i_5);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&i_5,0x400);
    for (expected_red_2 = 0.0; (uint)expected_red_2 < 0x100;
        expected_red_2 = (GLfloat)((int)expected_red_2 + 1)) {
      uVar14 = (ulong)(uint)expected_red_2;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)(uint)((int)expected_red_2 << 2));
      *pvVar13 = (float)uVar14 * 0.00390625;
      uVar14 = (ulong)(uint)expected_red_2;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_red_2 * 4 + 1));
      *pvVar13 = (float)uVar14 * 0.00390625;
      uVar14 = (ulong)(uint)expected_red_2;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_red_2 * 4 + 2));
      *pvVar13 = (float)uVar14 * 0.00390625;
      uVar14 = (ulong)(uint)expected_red_2;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_red_2 * 4 + 3));
      *pvVar13 = (float)uVar14 / 256.0;
    }
    pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&i_5,0);
    RobustBufferAccessBehavior::Texture::GetData(gl_00,0,0xde1,0x1908,0x1406,pvVar13);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (expected_green_1 = 0.0; (uint)expected_green_1 < 0x100;
        expected_green_1 = (GLfloat)((int)expected_green_1 + 1)) {
      expected_blue = (float)((uint)expected_green_1 & 0xf) * 0.0625;
      expected_alpha = (float)((uint)expected_green_1 >> 4) * 0.0625;
      drawn_red_2 = (float)(uint)expected_green_1 / 256.0;
      drawn_green_1 = 1.0;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)(uint)((int)expected_green_1 << 2));
      drawn_blue = *pvVar13;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_green_1 * 4 + 1));
      drawn_alpha = *pvVar13;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_green_1 * 4 + 2));
      local_3d4 = *pvVar13;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_5,
                           (ulong)((int)expected_green_1 * 4 + 3));
      local_3d8 = *pvVar13;
      if (((((expected_blue != drawn_blue) || (NAN(expected_blue) || NAN(drawn_blue))) ||
           (expected_alpha != drawn_alpha)) ||
          ((NAN(expected_alpha) || NAN(drawn_alpha) || (drawn_red_2 != local_3d4)))) ||
         ((NAN(drawn_red_2) || NAN(local_3d4) || ((local_3d8 != 1.0 || (NAN(local_3d8))))))) {
        pTVar9 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TestCase.m_context);
        pTVar10 = tcu::TestContext::getLog(pTVar9);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)
                   &pixels_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,pTVar10,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)
                             &pixels_3.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (char (*) [16])"Invalid value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_blue);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_alpha);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3d4);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3d8);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Expected value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&expected_blue);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&expected_alpha);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_red_2);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_green_1);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])". At offset: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(uint *)&expected_green_1);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder
                  ((MessageBuilder *)
                   &pixels_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&i_5);
  }
  else if ((this->super_TexelFetchTest).m_test_case == R32UI_MIPMAP) {
    RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7,0x400);
    for (expected_red_3 = 0; expected_red_3 < 0x100; expected_red_3 = expected_red_3 + 1) {
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7,
                           (ulong)expected_red_3);
      *pvVar15 = 0;
    }
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7,0);
    RobustBufferAccessBehavior::Texture::GetData(gl_00,1,0xde1,0x8d94,0x1405,pvVar15);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (drawn_red_3 = 0; drawn_red_3 < 0x100; drawn_red_3 = drawn_red_3 + 1) {
      local_57c = drawn_red_3;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7,
                           (ulong)drawn_red_3);
      local_580 = *pvVar15;
      if (local_57c != local_580) {
        pTVar9 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TestCase.m_context);
        pTVar10 = tcu::TestContext::getLog(pTVar9);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&program.m_context,pTVar10,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&program.m_context,(char (*) [16])"Invalid value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_580);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Expected value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_57c);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])" at offset: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_red_3);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&program.m_context);
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_7);
  }
  else if ((this->super_TexelFetchTest).m_test_case == R32UI_MULTISAMPLE) {
    RobustBufferAccessBehavior::Program::Program
              ((Program *)&destination_texture.m_context,
               (this->super_TexelFetchTest).super_TestCase.m_context);
    RobustBufferAccessBehavior::Texture::Texture
              ((Texture *)local_780,(this->super_TexelFetchTest).super_TestCase.m_context);
    RobustBufferAccessBehavior::Texture::Generate(gl_00,(GLuint *)local_780);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,local_780._0_4_,0xde1);
    RobustBufferAccessBehavior::Texture::Storage(gl_00,0xde1,1,0x8236,0x10,0x10,0);
    __s = verifyValidResults::cs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,__s,&local_7a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"",&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"",&local_7f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"",&local_819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"",&local_841);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_868,"",
               (allocator<char> *)
               ((long)&pixels_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    RobustBufferAccessBehavior::Program::Init
              ((Program *)&destination_texture.m_context,&local_7a0,&local_7c8,&local_7f0,&local_818
               ,&local_840,&local_868);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pixels_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator(&local_841);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator(&local_7a1);
    RobustBufferAccessBehavior::Program::Use((Program *)&destination_texture.m_context);
    (*gl_00->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xca3);
    (*gl_00->bindImageTexture)(1,local_780._0_4_,0,'\0',0,0x88b9,0x8236);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xca6);
    (*gl_00->uniform1i)(0,0);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xca9);
    (*gl_00->uniform1i)(1,1);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xcac);
    (*gl_00->dispatchCompute)(0x10,0x10,1);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xcaf);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9,0x100);
    for (expected_red_4 = 0; GVar1 = expected_red_4, expected_red_4 < 0x100;
        expected_red_4 = expected_red_4 + 1) {
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9,
                           (ulong)expected_red_4);
      *pvVar15 = GVar1;
    }
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9,0);
    RobustBufferAccessBehavior::Texture::GetData(gl_00,0,0xde1,0x8d94,0x1405,pvVar15);
    RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (drawn_red_4 = 0; drawn_red_4 < 0x100; drawn_red_4 = drawn_red_4 + 1) {
      local_894 = 1;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9,
                           (ulong)drawn_red_4);
      local_898 = *pvVar15;
      if (local_898 != 1) {
        pTVar9 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TestCase.m_context);
        pTVar10 = tcu::TestContext::getLog(pTVar9);
        tcu::TestLog::operator<<(&local_a18,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<(&local_a18,(char (*) [16])"Invalid value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_898);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Expected value: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_894);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])" at offset: ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&drawn_red_4);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_a18);
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_9);
    RobustBufferAccessBehavior::Texture::~Texture((Texture *)local_780);
    RobustBufferAccessBehavior::Program::~Program((Program *)&destination_texture.m_context);
  }
  return (bool)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool ImageLoadStoreTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = static_cast<GLubyte>(i);
			const GLubyte drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 2;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLbyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = static_cast<GLubyte>(i);
			pixels[i * n_channels + 1] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RG, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = static_cast<GLubyte>((i % 16) - 8);
			const GLbyte expected_green = static_cast<GLubyte>((i / 16) - 8);
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels * 4);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, 1 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 1;

		/* Compute shader */
		static const GLchar* cs =
			"#version 430 core\n"
			"\n"
			"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			"\n"
			"layout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\n"
			"layout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
			"    const uint  index = gl_WorkGroupID.y * 16 + gl_WorkGroupID.x;\n"
			"\n"
			"    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
			"    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
			"    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
			"    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
			"\n"
			"    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3))))\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n"
			"    }\n"
			"    else\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n"
			"    }\n"
			"}\n"
			"\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.uniform1i(0 /* location */, 0 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.uniform1i(1 /* location */, 1 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}